

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeDOMDocumentProcessor.cpp
# Opt level: O0

DOMDocument * __thiscall
xercesc_4_0::XIncludeDOMDocumentProcessor::doXIncludeDOMProcess
          (XIncludeDOMDocumentProcessor *this,DOMDocument *source,XMLErrorReporter *errorHandler,
          XMLEntityHandler *entityResolver)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  DOMDocument *parsedDocument;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Codes anon_var_0;
  DOMNode *docNode;
  DOMNode *newNode;
  DOMNode *child;
  DOMDocument *xincludedDocument;
  DOMImplementation *impl;
  XIncludeUtils xiu;
  XMLEntityHandler *entityResolver_local;
  XMLErrorReporter *errorHandler_local;
  DOMDocument *source_local;
  XIncludeDOMDocumentProcessor *this_local;
  
  xiu.fErrorReporter = (XMLErrorReporter *)entityResolver;
  XIncludeUtils::XIncludeUtils((XIncludeUtils *)&impl,errorHandler);
  iVar1 = (*(source->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xc])();
  parsedDocument =
       (DOMDocument *)
       (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
                 ((long *)CONCAT44(extraout_var,iVar1),XMLPlatformUtils::fgMemoryManager);
  iVar1 = (*(source->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
  (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1b])
            (parsedDocument,CONCAT44(extraout_var_00,iVar1));
  uVar2 = (*(source->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x16])();
  (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x17])
            (parsedDocument,(ulong)(uVar2 & 1));
  iVar1 = (*(source->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x18])();
  (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x19])
            (parsedDocument,CONCAT44(extraout_var_01,iVar1));
  iVar1 = (*(source->super_DOMNode)._vptr_DOMNode[7])(&source->super_DOMNode);
  newNode = (DOMNode *)CONCAT44(extraout_var_02,iVar1);
  while (newNode != (DOMNode *)0x0) {
    iVar1 = (*newNode->_vptr_DOMNode[4])();
    if (iVar1 != 10) {
      iVar1 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                        (parsedDocument,newNode,1);
      (*(parsedDocument->super_DOMNode)._vptr_DOMNode[0x11])
                (&parsedDocument->super_DOMNode,CONCAT44(extraout_var_03,iVar1));
    }
    iVar1 = (*newNode->_vptr_DOMNode[10])();
    newNode = (DOMNode *)CONCAT44(extraout_var_04,iVar1);
  }
  iVar1 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])();
  XIncludeUtils::parseDOMNodeDoingXInclude
            ((XIncludeUtils *)&impl,(DOMNode *)CONCAT44(extraout_var_05,iVar1),parsedDocument,
             (XMLEntityHandler *)xiu.fErrorReporter);
  (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x20])();
  XIncludeUtils::~XIncludeUtils((XIncludeUtils *)&impl);
  return parsedDocument;
}

Assistant:

DOMDocument *
XIncludeDOMDocumentProcessor::doXIncludeDOMProcess(const DOMDocument * const source, XMLErrorReporter *errorHandler, XMLEntityHandler* entityResolver /*=NULL*/){
    XIncludeUtils xiu(errorHandler);

    DOMImplementation* impl = source->getImplementation();
    DOMDocument *xincludedDocument = impl->createDocument();
    
    try
    {
        /* set up the declaration etc of the output document to match the source */
        xincludedDocument->setDocumentURI( source->getDocumentURI());
        xincludedDocument->setXmlStandalone( source->getXmlStandalone());
        xincludedDocument->setXmlVersion( source->getXmlVersion());

        /* copy entire source document into the xincluded document. Xincluded document can
           then be modified in place */
        DOMNode *child = source->getFirstChild();
        for (; child != NULL; child = child->getNextSibling()){
            if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE){
                /* I am simply ignoring these at the moment */
                continue;
            }
            DOMNode *newNode = xincludedDocument->importNode(child, true);
            xincludedDocument->appendChild(newNode);
        }

        DOMNode *docNode = xincludedDocument->getDocumentElement();
        /* parse and include the document node */
        xiu.parseDOMNodeDoingXInclude(docNode, xincludedDocument, entityResolver);

        xincludedDocument->normalizeDocument();
    }
    catch(const XMLErrs::Codes)
    {
        xincludedDocument->release();
        return NULL;
    }
    catch(...)
    {
        xincludedDocument->release();
        throw;
    }

    return xincludedDocument;
}